

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

Label * __thiscall wabt::anon_unknown_0::CWriter::FindLabel(CWriter *this,Var *var,bool mark_used)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  size_type sVar4;
  string *__rhs;
  int __c;
  Var *__s;
  int local_2c;
  reference pvStack_28;
  Index i;
  Label *label;
  bool mark_used_local;
  Var *var_local;
  CWriter *this_local;
  
  pvStack_28 = (reference)0x0;
  __s = var;
  bVar1 = Var::is_index(var);
  if (bVar1) {
    pcVar3 = Var::index(var,(char *)__s,__c);
    sVar4 = std::
            vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    if ((int)pcVar3 + 1 != sVar4) {
      __assert_fail("var.index() + 1 == label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x266,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
    pvStack_28 = std::
                 vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                 ::operator[](&this->label_stack_,0);
  }
  else {
    bVar1 = Var::is_name(var);
    if (!bVar1) {
      __assert_fail("var.is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x269,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
    sVar4 = std::
            vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    for (local_2c = (int)sVar4; local_2c != 0; local_2c = local_2c + -1) {
      pvStack_28 = std::
                   vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                   ::operator[](&this->label_stack_,(ulong)(local_2c - 1));
      __lhs = pvStack_28->name;
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==(__lhs,__rhs);
      if (_Var2) break;
    }
  }
  if (pvStack_28 == (reference)0x0) {
    __assert_fail("label",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0x271,
                  "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)")
    ;
  }
  if (mark_used) {
    pvStack_28->used = true;
  }
  return pvStack_28;
}

Assistant:

const Label* CWriter::FindLabel(const Var& var, bool mark_used) {
  Label* label = nullptr;

  if (var.is_index()) {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    assert(var.index() + 1 == label_stack_.size());
    label = &label_stack_[0];
  } else {
    assert(var.is_name());
    for (Index i = label_stack_.size(); i > 0; --i) {
      label = &label_stack_[i - 1];
      if (label->name == var.name())
        break;
    }
  }

  assert(label);
  if (mark_used) {
    label->used = true;
  }
  return label;
}